

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseParameters(MipsParser *this,Parser *parser,tMipsOpcode *opcode)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  char cVar5;
  Token *pTVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  char *pcVar10;
  MipsParser *this_00;
  char *encoding;
  int local_12c;
  tMipsOpcode *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  int *local_110;
  MipsRegisterValue *local_108;
  _Alloc_hider local_100;
  Expression *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  MipsRegisterValue *local_e0;
  MipsRegisterValue *local_d8;
  _Alloc_hider local_d0;
  MipsRegisterValue *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  int *local_b0;
  MipsRegisterValue *local_a8;
  _Alloc_hider local_a0;
  MipsRegisterValue *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int *local_80;
  MipsImmediateData *local_78;
  _Alloc_hider local_70;
  Expression *local_68;
  MipsRegisterValue tempRegister;
  
  encoding = opcode->encoding;
  (this->immediate).primary.type = None;
  if (this->hasFixedSecondaryImmediate == false) {
    (this->immediate).secondary.type = None;
  }
  local_12c = (this->opcodeData).vfpuSize;
  if (local_12c == -1) {
    uVar3 = opcode->flags;
    local_12c = 0;
    if ((uVar3 >> 0x13 & 1) == 0) {
      if ((uVar3 >> 0x16 & 1) == 0) {
        if ((uVar3 >> 0x17 & 1) == 0) {
          if ((uVar3 >> 0x14 & 1) == 0) {
            local_12c = -1;
            goto LAB_0015ac06;
          }
          local_12c = 3;
        }
        else {
          local_12c = 2;
        }
      }
      else {
        local_12c = 1;
      }
    }
    (this->opcodeData).vfpuSize = local_12c;
  }
LAB_0015ac06:
  local_78 = &this->immediate;
  local_90._M_allocated_capacity = (size_type)&this->opcodeData;
  tempRegister.name._name._M_dataplus._M_p = (pointer)&tempRegister.name._name.field_2;
  tempRegister.name._name.field_2._M_allocated_capacity = 0;
  tempRegister.name._name.field_2._8_8_ = 0;
  tempRegister.name._name._M_string_length = 0;
  local_110 = &(this->immediate).primary.originalValue;
  local_80 = &(this->opcodeData).vectorCondition;
  local_b0 = &(this->immediate).secondary.originalValue;
  local_f8 = &(this->immediate).secondary.expression;
  local_68 = &(this->immediate).primary.expression;
  local_c0._8_8_ = &(this->registers).rspvealt;
  local_c0._M_allocated_capacity = (size_type)&(this->registers).rspvde;
  local_f0._M_allocated_capacity = (size_type)&(this->registers).rspve;
  local_c8 = &(this->registers).rspvrs;
  local_d0._M_p = (pointer)&(this->registers).rspvrd;
  local_d8 = &(this->registers).rspvrt;
  local_120._M_allocated_capacity = (size_type)&(this->registers).grd;
  local_f0._8_8_ = &(this->registers).grt;
  local_98 = &(this->registers).ps2vrs;
  local_a0._M_p = (pointer)&(this->registers).ps2vrd;
  local_a8 = &(this->registers).ps2vrt;
  local_120._8_8_ = &(this->registers).vrd;
  local_100._M_p = (pointer)&(this->registers).vrt;
  local_108 = &(this->registers).vrs;
  local_e0 = &(this->registers).frs;
  local_90._8_8_ = &(this->registers).frd;
  local_70._M_p = (pointer)&(this->registers).frt;
  pcVar9 = encoding;
  this_00 = this;
  local_128 = opcode;
LAB_0015ad7b:
  cVar5 = *pcVar9;
  if (cVar5 == '\0') {
    pcVar9 = local_128->name;
    pcVar10 = local_128->encoding;
    uVar8 = *(undefined8 *)&local_128->flags;
    *(undefined8 *)(local_90._M_allocated_capacity + 0x10) = *(undefined8 *)&local_128->destencoding
    ;
    *(undefined8 *)(local_90._M_allocated_capacity + 0x18) = uVar8;
    *(char **)local_90._M_allocated_capacity = pcVar9;
    *(char **)(local_90._M_allocated_capacity + 8) = pcVar10;
    setOmittedRegisters(this,local_128);
    pTVar6 = Parser::nextToken(parser);
    bVar4 = pTVar6->type == Separator;
    goto switchD_0015ae86_caseD_64;
  }
  pcVar10 = pcVar9 + 1;
  encoding = pcVar10;
  switch(cVar5) {
  case 'R':
    encoding = pcVar9 + 2;
    bVar4 = false;
    switch(pcVar9[1]) {
    case 'c':
      bVar4 = parseRspVectorControlRegister
                        (this_00,parser,(MipsRegisterValue *)local_120._M_allocated_capacity);
      break;
    case 'd':
      bVar4 = parseRspVectorRegister(this_00,parser,(MipsRegisterValue *)local_d0._M_p);
      break;
    case 'e':
      bVar4 = parseRspVectorElement
                        (this_00,parser,(MipsRegisterValue *)local_f0._M_allocated_capacity);
      break;
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'n':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0015ae86_caseD_64;
    case 'l':
      bVar4 = parseRspScalarElement
                        (this_00,parser,(MipsRegisterValue *)local_f0._M_allocated_capacity);
      break;
    case 'm':
      bVar4 = parseRspScalarElement
                        (this_00,parser,(MipsRegisterValue *)local_c0._M_allocated_capacity);
      break;
    case 'o':
      bVar4 = parseRspOffsetElement(this_00,parser,(MipsRegisterValue *)local_c0._8_8_);
      break;
    case 's':
      bVar4 = parseRspVectorRegister(this_00,parser,local_c8);
      break;
    case 't':
      bVar4 = parseRspVectorRegister(this_00,parser,local_d8);
      break;
    default:
      if (pcVar9[1] != 'z') goto switchD_0015ae86_caseD_64;
      bVar4 = parseRspCop0Register
                        (this_00,parser,(MipsRegisterValue *)local_120._M_allocated_capacity);
    }
    goto LAB_0015b43c;
  case 'S':
    bVar4 = parseFpuRegister(this_00,parser,local_e0);
    break;
  case 'T':
    bVar4 = parseFpuRegister(this_00,parser,(MipsRegisterValue *)local_70._M_p);
    break;
  case 'U':
  case 'X':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'a':
  case 'b':
  case 'c':
  case 'e':
  case 'h':
  case 'k':
  case 'l':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'u':
  case 'x':
  case 'y':
switchD_0015ad9e_caseD_55:
    bVar4 = matchSymbol(this_00,parser,cVar5);
    break;
  case 'V':
    encoding = pcVar9 + 2;
    cVar5 = pcVar9[1];
    if (cVar5 == 'd') {
      bVar4 = parsePs2Cop2Register(this_00,parser,(MipsRegisterValue *)local_a0._M_p);
    }
    else {
      if (cVar5 != 's') {
        if (cVar5 == 't') {
          bVar4 = parsePs2Cop2Register(this_00,parser,local_a8);
          goto LAB_0015b43c;
        }
        goto LAB_0015b447;
      }
      bVar4 = parsePs2Cop2Register(this_00,parser,local_98);
    }
    goto LAB_0015b43c;
  case 'W':
    pcVar10 = pcVar9 + 2;
    cVar5 = pcVar9[1];
    pcVar9 = pcVar10;
    encoding = pcVar10;
    if (cVar5 == 'c') {
      bVar4 = parseVcstParameter(this_00,parser,local_110);
    }
    else {
      if (cVar5 == 'd') {
        bVar4 = parseVpfxdParameter(this_00,parser,local_110);
        if (!bVar4) goto LAB_0015b447;
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate16;
        goto LAB_0015ad7b;
      }
      if (cVar5 != 'r') {
        if ((cVar5 != 's') || (bVar4 = parseVpfxsParameter(this_00,parser,local_110), !bVar4))
        goto LAB_0015b447;
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate20_0;
        goto LAB_0015ad7b;
      }
      bVar4 = parseVfpuVrot(this_00,parser,local_110,(this->opcodeData).vfpuSize);
    }
    if (bVar4 == false) goto LAB_0015b447;
    (this->immediate).primary.value = (this->immediate).primary.originalValue;
    (this->immediate).primary.type = Immediate5;
    goto LAB_0015ad7b;
  case 'd':
    bVar4 = parseRegister(this_00,parser,(MipsRegisterValue *)local_120._M_allocated_capacity);
    break;
  case 'f':
    bVar4 = parseFpuControlRegister(this_00,parser,local_e0);
    break;
  case 'g':
    encoding = pcVar9 + 2;
    cVar5 = pcVar9[1];
    if (cVar5 == 'c') {
      bVar4 = parsePsxCop2ControlRegister
                        (this_00,parser,(MipsRegisterValue *)local_120._M_allocated_capacity);
    }
    else if (cVar5 == 's') {
      bVar4 = parsePsxCop2DataRegister
                        (this_00,parser,(MipsRegisterValue *)local_120._M_allocated_capacity);
    }
    else {
      if (cVar5 != 't') goto LAB_0015b447;
      bVar4 = parsePsxCop2DataRegister(this_00,parser,(MipsRegisterValue *)local_f0._8_8_);
    }
LAB_0015b43c:
    pcVar10 = pcVar9 + 2;
    break;
  case 'i':
    bVar4 = parseImmediate(this_00,parser,local_68);
    if ((!bVar4) ||
       (this_00 = (MipsParser *)&encoding,
       bVar4 = decodeImmediateSize(&encoding,(MipsImmediateType *)local_78), pcVar9 = encoding,
       !bVar4)) goto LAB_0015b447;
    goto LAB_0015ad7b;
  case 'j':
    pcVar10 = pcVar9 + 2;
    bVar4 = false;
    encoding = pcVar10;
    switch(pcVar9[1]) {
    case 'b':
      bVar4 = parseCop2BranchCondition(this_00,parser,local_b0);
      if (!bVar4) goto LAB_0015b447;
      (this->immediate).secondary.type = Cop2BranchType;
      (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
      pcVar9 = pcVar10;
      break;
    case 'c':
      bVar4 = parseImmediate(this_00,parser,local_f8);
      if (!bVar4) goto LAB_0015b447;
      (this->immediate).secondary.type = CacheOp;
      pcVar9 = pcVar10;
      break;
    default:
      goto switchD_0015ae86_caseD_64;
    case 'e':
      bVar4 = parseImmediate(this_00,parser,local_f8);
      if (!bVar4) goto LAB_0015b447;
      (this->immediate).secondary.type = Ext;
      pcVar9 = pcVar10;
      break;
    case 'i':
      bVar4 = parseImmediate(this_00,parser,local_f8);
      if (!bVar4) goto LAB_0015b447;
      (this->immediate).secondary.type = Ins;
      pcVar9 = pcVar10;
    }
    goto LAB_0015ad7b;
  case 'm':
    pcVar10 = pcVar9 + 2;
    cVar5 = pcVar9[1];
    encoding = pcVar10;
    if (cVar5 == 'd') {
      bVar4 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_120._8_8_,
                                (this->opcodeData).vfpuSize);
      uVar8 = local_120._8_8_;
    }
    else {
      if (cVar5 != 't') {
        if ((cVar5 != 's') ||
           (bVar4 = parseVfpuRegister(this_00,parser,local_108,(this->opcodeData).vfpuSize),
           !bVar4 || local_108->type != VfpuMatrix)) goto LAB_0015b447;
        pcVar9 = pcVar10;
        if ((local_128->flags & 0x200000) != 0) {
          piVar1 = &(this->registers).vrs.num;
          *(byte *)piVar1 = (byte)*piVar1 ^ 0x20;
        }
        goto LAB_0015ad7b;
      }
      bVar4 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_100._M_p,
                                (this->opcodeData).vfpuSize);
      uVar8 = local_100._M_p;
    }
    bVar4 = (bool)(bVar4 & ((MipsRegisterValue *)uVar8)->type == VfpuMatrix);
    break;
  case 'r':
    bVar4 = parseRegister(this_00,parser,&tempRegister);
    if ((!bVar4) ||
       (encoding = pcVar9 + 2, pcVar10 = pcVar9 + 1, pcVar9 = encoding, tempRegister.num != *pcVar10
       )) goto LAB_0015b447;
    goto LAB_0015ad7b;
  case 's':
    bVar4 = parseRegister(this_00,parser,(MipsRegisterValue *)this);
    break;
  case 't':
    bVar4 = parseRegister(this_00,parser,(MipsRegisterValue *)local_f0._8_8_);
    break;
  case 'v':
    cVar5 = *pcVar10;
    lVar7 = 1;
    if (cVar5 == 'S') {
      cVar5 = pcVar9[2];
      local_12c = 0;
      lVar7 = 2;
    }
    pcVar10 = pcVar9 + lVar7 + 1;
    encoding = pcVar10;
    if (cVar5 == 'c') {
      bVar4 = parseVfpuControlRegister(this_00,parser,(MipsRegisterValue *)local_120._8_8_);
      break;
    }
    pcVar9 = pcVar10;
    if (cVar5 == 'd') {
      bVar4 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_120._8_8_,local_12c);
      if (!bVar4 || *(int *)local_120._8_8_ != 7) goto LAB_0015b447;
      if ((local_128->flags & 0x40000) == 0) goto LAB_0015ad7b;
      bVar2 = (byte)(this->registers).vrd.num;
    }
    else {
      if (cVar5 != 't') {
        if ((cVar5 != 's') ||
           (bVar4 = parseVfpuRegister(this_00,parser,local_108,local_12c),
           !bVar4 || local_108->type != VfpuVector)) goto LAB_0015b447;
        if ((local_128->flags & 0x40000) != 0) {
          bVar2 = (byte)(this->registers).vrs.num;
          goto joined_r0x0015b3af;
        }
        goto LAB_0015ad7b;
      }
      bVar4 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_100._M_p,local_12c);
      if (!bVar4 || *(int *)local_100._M_p != 7) goto LAB_0015b447;
      if ((local_128->flags & 0x40000) == 0) goto LAB_0015ad7b;
      bVar2 = (byte)(this->registers).vrt.num;
    }
joined_r0x0015b3af:
    if ((bVar2 & 0x40) != 0) {
LAB_0015b447:
      bVar4 = false;
switchD_0015ae86_caseD_64:
      std::__cxx11::string::~string((string *)&tempRegister.name);
      return bVar4;
    }
    goto LAB_0015ad7b;
  case 'w':
    bVar4 = parseWb(this_00,parser);
    break;
  case 'z':
    bVar4 = parseCop0Register(this_00,parser,(MipsRegisterValue *)local_120._M_allocated_capacity);
    break;
  default:
    if (cVar5 == 'C') {
      bVar4 = parseVfpuCondition(this_00,parser,local_80);
    }
    else {
      if (cVar5 != 'D') goto switchD_0015ad9e_caseD_55;
      bVar4 = parseFpuRegister(this_00,parser,(MipsRegisterValue *)local_90._8_8_);
    }
  }
  pcVar9 = pcVar10;
  if (bVar4 == false) goto LAB_0015b447;
  goto LAB_0015ad7b;
}

Assistant:

bool MipsParser::parseParameters(Parser& parser, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = MipsImmediateType::None;
	if (!hasFixedSecondaryImmediate)
		immediate.secondary.type = MipsImmediateType::None;

	if (opcodeData.vfpuSize == -1)
	{
		if (opcode.flags & MO_VFPU_SINGLE)
			opcodeData.vfpuSize = 0;
		else if (opcode.flags & MO_VFPU_PAIR)
			opcodeData.vfpuSize = 1;
		else if (opcode.flags & MO_VFPU_TRIPLE)
			opcodeData.vfpuSize = 2;
		else if (opcode.flags & MO_VFPU_QUAD)
			opcodeData.vfpuSize = 3;
	}

	// parse parameters
	MipsRegisterValue tempRegister;
	int actualSize = opcodeData.vfpuSize;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'T':	// float register
			CHECK(parseFpuRegister(parser,registers.frt));
			break;
		case 'D':	// float register
			CHECK(parseFpuRegister(parser,registers.frd));
			break;
		case 'S':	// float register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'f':	// fpu control register
			CHECK(parseFpuControlRegister(parser,registers.frs));
			break;
		case 'z':	// cop0 register
			CHECK(parseCop0Register(parser,registers.grd));
			break;
		case 'v':	// psp vfpu reg
			if (*encoding == 'S')
			{
				encoding++;
				actualSize = 0;
			}

			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,actualSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrs.num & 0x40));
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,actualSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrt.num & 0x40));
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,actualSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrd.num & 0x40));
				break;
			case 'c':
				CHECK(parseVfpuControlRegister(parser,registers.vrd));
				break;
			default:
				return false;
			}
			break;
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,opcodeData.vfpuSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuMatrix);
				if (opcode.flags & MO_VFPU_TRANSPOSE_VS)
					registers.vrs.num ^= 0x20;
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,opcodeData.vfpuSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuMatrix);
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,opcodeData.vfpuSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuMatrix);
				break;
			default:
				return false;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 't':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrt));
				break;
			case 'd':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrd));
				break;
			case 's':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrs));
				break;
			default:
				return false;
			}
			break;
		case 'g':	// psx cop2 reg
			switch (*encoding++)
			{
			case 't':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grt));
				break;
			case 's':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grd));
				break;
			case 'c':	// gte control register
				CHECK(parsePsxCop2ControlRegister(parser,registers.grd));
				break;
			default:
				return false;
			}
			break;
		case 'r':	// forced register
			CHECK(parseRegister(parser,tempRegister));
			CHECK(tempRegister.num == *encoding++);
			break;
		case 'R':	// rsp register
			switch (*encoding++)
			{
			case 'z':	// cop0 register
				CHECK(parseRspCop0Register(parser,registers.grd));
				break;
			case 'c':	// vector control register
				CHECK(parseRspVectorControlRegister(parser,registers.grd));
				break;
			case 't':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrt));
				break;
			case 'd':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrd));
				break;
			case 's':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrs));
				break;
			case 'e':	// vector element
				CHECK(parseRspVectorElement(parser,registers.rspve));
				break;
			case 'l':	// scalar element
				CHECK(parseRspScalarElement(parser,registers.rspve));
				break;
			case 'm':	// scalar destination element
				CHECK(parseRspScalarElement(parser,registers.rspvde));
				break;
			case 'o':	// byte offset element
				CHECK(parseRspOffsetElement(parser,registers.rspvealt));
				break;
			default:
				return false;
			}
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case 'j':	// secondary immediate
			switch (*encoding++)
			{
			case 'c':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::CacheOp;
				break;
			case 'e':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ext;
				break;
			case 'i':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ins;
				break;
			case 'b':
				CHECK(parseCop2BranchCondition(parser,immediate.secondary.originalValue));
				immediate.secondary.type = MipsImmediateType::Cop2BranchType;
				immediate.secondary.value = immediate.secondary.originalValue;
				break;
			default:
				return false;
			}
			break;
		case 'C':	// vfpu condition
			CHECK(parseVfpuCondition(parser,opcodeData.vectorCondition));
			break;
		case 'W':	// vfpu argument
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVpfxsParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate20_0;
				break;
			case 'd':
				CHECK(parseVpfxdParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate16;
				break;
			case 'c':
				CHECK(parseVcstParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			case 'r':
				CHECK(parseVfpuVrot(parser,immediate.primary.originalValue,opcodeData.vfpuSize));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			default:
				return false;
			}
			break;
		case 'w':	// 'wb' characters
			CHECK(parseWb(parser));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;
	setOmittedRegisters(opcode);

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}